

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_over_exert(player *p,wchar_t flag,wchar_t chance,wchar_t amount)

{
  wchar_t wVar1;
  uint32_t uVar2;
  bool local_49;
  char local_48 [8];
  char dam_text [32];
  wchar_t dam;
  _Bool perm;
  wchar_t amount_local;
  wchar_t chance_local;
  wchar_t flag_local;
  player *p_local;
  
  if (L'\0' < chance) {
    if (((flag & 1U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      uVar2 = Rand_div(100);
      local_49 = (int)uVar2 < chance / 2 && L'1' < chance;
      msg("You have damaged your health!");
      player_stat_dec(p,L'\x04',local_49);
    }
    if (((flag & 2U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      msg("You faint from the effort!");
      uVar2 = Rand_div(amount);
      player_inc_timed(p,L'\x03',uVar2 + L'\x01',true,true,false);
    }
    if (((flag & 4U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      uVar2 = Rand_div(amount);
      player_inc_timed(p,L'\x1f',uVar2 + L'\x01',true,true,true);
    }
    if (((flag & 8U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      msg("Wounds appear on your body!");
      uVar2 = Rand_div(amount);
      player_inc_timed(p,L'\b',uVar2 + L'\x01',true,true,false);
    }
    if (((flag & 0x10U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      uVar2 = Rand_div(amount);
      player_inc_timed(p,L'\x04',uVar2 + L'\x01',true,true,true);
    }
    if (((flag & 0x20U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      uVar2 = Rand_div(amount);
      player_inc_timed(p,L'\x06',uVar2 + L'\x01',true,true,true);
    }
    if (((flag & 0x40U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      msg("You feel suddenly lethargic.");
      uVar2 = Rand_div(amount);
      player_inc_timed(p,L'\x01',uVar2 + L'\x01',true,true,false);
    }
    if (((flag & 0x80U) != 0) && (wVar1 = Rand_div(100), wVar1 < chance)) {
      uVar2 = Rand_div(amount);
      dam_text._28_4_ = player_apply_damage_reduction(p,uVar2 + L'\x01');
      memset(local_48,0,0x20);
      if ((0 < (int)dam_text._28_4_) && (((p->opts).opt[3] & 1U) != 0)) {
        strnfmt(local_48,0x20," (%d)",(ulong)(uint)dam_text._28_4_);
      }
      msg("You cry out in sudden pain!%s",local_48);
      take_hit(p,dam_text._28_4_,"over-exertion");
    }
  }
  return;
}

Assistant:

void player_over_exert(struct player *p, int flag, int chance, int amount)
{
	if (chance <= 0) return;

	/* CON damage */
	if (flag & PY_EXERT_CON) {
		if (randint0(100) < chance) {
			/* Hack - only permanent with high chance (no-mana casting) */
			bool perm = (randint0(100) < chance / 2) && (chance >= 50);
			msg("You have damaged your health!");
			player_stat_dec(p, STAT_CON, perm);
		}
	}

	/* Fainting */
	if (flag & PY_EXERT_FAINT) {
		if (randint0(100) < chance) {
			msg("You faint from the effort!");

			/* Bypass free action */
			(void)player_inc_timed(p, TMD_PARALYZED,
				randint1(amount), true, true, false);
		}
	}

	/* Scrambled stats */
	if (flag & PY_EXERT_SCRAMBLE) {
		if (randint0(100) < chance) {
			(void)player_inc_timed(p, TMD_SCRAMBLE,
				randint1(amount), true, true, true);
		}
	}

	/* Cut damage */
	if (flag & PY_EXERT_CUT) {
		if (randint0(100) < chance) {
			msg("Wounds appear on your body!");
			(void)player_inc_timed(p, TMD_CUT, randint1(amount),
				true, true, false);
		}
	}

	/* Confusion */
	if (flag & PY_EXERT_CONF) {
		if (randint0(100) < chance) {
			(void)player_inc_timed(p, TMD_CONFUSED,
				randint1(amount), true, true, true);
		}
	}

	/* Hallucination */
	if (flag & PY_EXERT_HALLU) {
		if (randint0(100) < chance) {
			(void)player_inc_timed(p, TMD_IMAGE, randint1(amount),
				true, true, true);
		}
	}

	/* Slowing */
	if (flag & PY_EXERT_SLOW) {
		if (randint0(100) < chance) {
			msg("You feel suddenly lethargic.");
			(void)player_inc_timed(p, TMD_SLOW, randint1(amount),
				true, true, false);
		}
	}

	/* HP */
	if (flag & PY_EXERT_HP) {
		if (randint0(100) < chance) {
			int dam = player_apply_damage_reduction(p,
				randint1(amount));
			char dam_text[32] = "";

			if (dam > 0 && OPT(p, show_damage)) {
				strnfmt(dam_text, sizeof(dam_text),
					" (%d)", dam);
			}
			msg("You cry out in sudden pain!%s", dam_text);
			take_hit(p, dam, "over-exertion");
		}
	}
}